

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimp3_ex.h
# Opt level: O0

int mp3dec_ex_open(mp3dec_ex_t *dec,char *file_name,int flags)

{
  uint in_EDX;
  long in_RDI;
  int ret;
  mp3dec_map_info_t *in_stack_00000070;
  char *in_stack_00000078;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = -1;
  }
  else {
    local_4 = mp3dec_open_file(in_stack_00000078,in_stack_00000070);
    if (local_4 == 0) {
      local_4 = mp3dec_ex_open_mapinfo
                          ((mp3dec_ex_t *)((ulong)in_EDX << 0x20),in_stack_ffffffffffffffdc);
    }
  }
  return local_4;
}

Assistant:

int mp3dec_ex_open(mp3dec_ex_t *dec, const char *file_name, int flags)
{
    int ret;
    if (!dec)
        return MP3D_E_PARAM;
    if ((ret = mp3dec_open_file(file_name, &dec->file)))
        return ret;
    return mp3dec_ex_open_mapinfo(dec, flags);
}